

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O3

void RDL_deleteURFInfo(RDL_URFinfo *uInfo)

{
  ulong uVar1;
  
  if (uInfo->nofWeights != 0) {
    uVar1 = 0;
    do {
      free(*uInfo->URFrel[uVar1]);
      free(uInfo->URFrel[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < uInfo->nofWeights);
  }
  free(uInfo->URFrel);
  free(uInfo->nofProtos);
  if (uInfo->nofURFs != 0) {
    uVar1 = 0;
    do {
      free(uInfo->URFs[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < uInfo->nofURFs);
  }
  free(uInfo->URFs);
  free(uInfo->nofCFsPerURF);
  free(uInfo);
  return;
}

Assistant:

void RDL_deleteURFInfo(RDL_URFinfo *uInfo)
{
  unsigned i;
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(uInfo->URFrel[i][0]);
    free(uInfo->URFrel[i]);
  }
  free(uInfo->URFrel);
  free(uInfo->nofProtos);
  for(i=0; i<uInfo->nofURFs; ++i)
  {
    free(uInfo->URFs[i]);
  }
  free(uInfo->URFs);
  free(uInfo->nofCFsPerURF);
  free(uInfo);
}